

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O3

uint32_t duckdb::DecodeBase64Bytes<true>(string_t *str,const_data_ptr_t input_data,idx_t base_idx)

{
  int iVar1;
  ulong uVar2;
  ConversionException *this;
  char *pcVar3;
  int decoded_bytes [4];
  int local_88 [6];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = 0;
  do {
    if (input_data[base_idx] == 0x3d && 1 < uVar2) {
      local_88[uVar2] = 0;
    }
    else {
      iVar1 = *(int *)(BASE64_DECODING_TABLE + (ulong)input_data[base_idx] * 4);
      local_88[uVar2] = iVar1;
      if (iVar1 < 0) {
        this = (ConversionException *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,
                   "Could not decode string \"%s\" as base64: invalid byte value \'%d\' at position %d"
                   ,"");
        uVar2 = (ulong)(str->value).pointer.length;
        if (uVar2 < 0xd) {
          pcVar3 = (str->value).pointer.prefix;
        }
        else {
          pcVar3 = (str->value).pointer.ptr;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar3,pcVar3 + uVar2)
        ;
        ConversionException::ConversionException<std::__cxx11::string,unsigned_char,unsigned_long>
                  (this,&local_70,&local_50,input_data[base_idx],base_idx);
        __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar2 = uVar2 + 1;
    base_idx = base_idx + 1;
  } while (uVar2 != 4);
  return local_88[2] * 0x40 + local_88[1] * 0x1000 + local_88[0] * 0x40000 + local_88[3];
}

Assistant:

uint32_t DecodeBase64Bytes(const string_t &str, const_data_ptr_t input_data, idx_t base_idx) {
	int decoded_bytes[4];
	for (idx_t decode_idx = 0; decode_idx < 4; decode_idx++) {
		if (ALLOW_PADDING && decode_idx >= 2 && input_data[base_idx + decode_idx] == Blob::BASE64_PADDING) {
			// the last two bytes of a base64 string can have padding: in this case we set the byte to 0
			decoded_bytes[decode_idx] = 0;
		} else {
			decoded_bytes[decode_idx] = BASE64_DECODING_TABLE[input_data[base_idx + decode_idx]];
		}
		if (decoded_bytes[decode_idx] < 0) {
			throw ConversionException(
			    "Could not decode string \"%s\" as base64: invalid byte value '%d' at position %d", str.GetString(),
			    input_data[base_idx + decode_idx], base_idx + decode_idx);
		}
	}
	return UnsafeNumericCast<uint32_t>((decoded_bytes[0] << 3 * 6) + (decoded_bytes[1] << 2 * 6) +
	                                   (decoded_bytes[2] << 1 * 6) + (decoded_bytes[3] << 0 * 6));
}